

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hidpi.c
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  mfb_update_state mVar2;
  mfb_window *window;
  mfb_window *window_00;
  
  pretty_square(g_buffer_low,0x200);
  pretty_square(g_buffer_high,0x400);
  window = mfb_open("LowRes",0x200,0x200);
  window_00 = mfb_open("HighRes",0x200,0x200);
  do {
    if (window_00 == (mfb_window *)0x0 && window == (mfb_window *)0x0) {
      return 0;
    }
    if (window == (mfb_window *)0x0) {
LAB_0010253c:
      window = (mfb_window *)0x0;
    }
    else {
      mVar2 = mfb_update_ex(window,g_buffer_low,0x200,0x200);
      if (mVar2 != STATE_OK) goto LAB_0010253c;
      _Var1 = mfb_wait_sync(window);
      if (!_Var1) goto LAB_0010253c;
    }
    if (window_00 == (mfb_window *)0x0) goto LAB_00102569;
    mVar2 = mfb_update_ex(window_00,g_buffer_high,0x400,0x400);
    if (mVar2 != STATE_OK) goto LAB_00102569;
    _Var1 = mfb_wait_sync(window_00);
    if (!_Var1) {
LAB_00102569:
      window_00 = (mfb_window *)0x0;
    }
  } while( true );
}

Assistant:

int 
main()
{
  pretty_square(g_buffer_low, DIMEN_LOW);
  pretty_square(g_buffer_high, DIMEN_HIGH);

  struct mfb_window *window_low = mfb_open("LowRes", DIMEN_LOW, DIMEN_LOW);
  struct mfb_window *window_high = mfb_open("HighRes", DIMEN_HIGH/2, DIMEN_HIGH/2);

  while (window_high || window_low)
    {
      if (window_low)
	if (mfb_update_ex(window_low, g_buffer_low, DIMEN_LOW, DIMEN_LOW) != STATE_OK
	      || !mfb_wait_sync(window_low))
	    window_low = NULL;

      if (window_high)
	if (mfb_update_ex(window_high, g_buffer_high, DIMEN_HIGH, DIMEN_HIGH) != STATE_OK
	    || !mfb_wait_sync(window_high))
	  window_high = NULL;
    }
  
  return 0;
}